

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor.h
# Opt level: O1

void escreverCor(ostream *out,cor corPixel,int samplesPorPixel)

{
  ostream *poVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Dd_01;
  double dVar4;
  double dVar5;
  char local_4b [3];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  dVar4 = 1.0 / (double)samplesPorPixel;
  uVar2 = 0;
  uVar3 = 0;
  dVar5 = corPixel.e[0] * dVar4;
  local_48._8_8_ = local_48._0_8_;
  local_48._0_8_ = dVar4;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
    uVar2 = extraout_XMM0_Dc;
    uVar3 = extraout_XMM0_Dd;
    dVar4 = (double)local_48._0_8_;
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  local_38._8_4_ = uVar2;
  local_38._0_8_ = dVar5;
  local_38._12_4_ = uVar3;
  uVar2 = 0;
  uVar3 = 0;
  dVar5 = corPixel.e[1] * dVar4;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
    uVar2 = extraout_XMM0_Dc_00;
    uVar3 = extraout_XMM0_Dd_00;
    dVar4 = (double)local_48._0_8_;
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  local_28._8_4_ = uVar2;
  local_28._0_8_ = dVar5;
  local_28._12_4_ = uVar3;
  dVar4 = dVar4 * corPixel.e[2];
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
    uVar2 = extraout_XMM0_Dc_01;
    uVar3 = extraout_XMM0_Dd_01;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    dVar4 = SQRT(dVar4);
  }
  local_48._8_4_ = uVar2;
  local_48._0_8_ = dVar4;
  local_48._12_4_ = uVar3;
  uVar2 = 0xd916872b;
  uVar3 = 0x3feff7ce;
  if (local_38._0_8_ <= 0.999) {
    uVar2 = local_38._0_4_;
    uVar3 = local_38._4_4_;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)out,
                      (int)(double)(~-(ulong)(local_38._0_8_ < 0.0) &
                                   (ulong)((double)CONCAT44(uVar3,uVar2) * 256.0)));
  local_4b[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b,1);
  uVar2 = 0xd916872b;
  uVar3 = 0x3feff7ce;
  if (local_28._0_8_ <= 0.999) {
    uVar2 = local_28._0_4_;
    uVar3 = local_28._4_4_;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      (int)(double)(~-(ulong)(local_28._0_8_ < 0.0) &
                                   (ulong)((double)CONCAT44(uVar3,uVar2) * 256.0)));
  local_4b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b + 1,1);
  dVar5 = 0.999;
  if ((double)local_48._0_8_ <= 0.999) {
    dVar5 = (double)local_48._0_8_;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      (int)(double)(~-(ulong)((double)local_48._0_8_ < 0.0) & (ulong)(dVar5 * 256.0)
                                   ));
  local_4b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b + 2,1);
  return;
}

Assistant:

void escreverCor(std::ostream &out, cor corPixel, const int samplesPorPixel) {
    const double escala = 1.0 / samplesPorPixel;

    // Pegar a cor de cada pixel, dividindo pela escala
    // Realizar correção de gamma para gamma 2
    const double r = sqrt(corPixel.x() * escala);
    const double g = sqrt(corPixel.y() * escala);
    const double b = sqrt(corPixel.z() * escala);

    // Escrever as cores mapeadas entre 0 <= cor < 1
    out << static_cast<int>(256 * clamp(r, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(g, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(b, 0.0, 0.999)) << '\n';
}